

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_advanced
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_parameters params)

{
  ZSTD_compressionParameters cParams;
  undefined1 auVar1 [20];
  uint uVar2;
  undefined4 in_stack_ffffffffffffff94;
  ZSTD_strategy in_stack_ffffffffffffff98;
  size_t errcod;
  void *dict_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  auVar1 = params.cParams._8_20_;
  cParams.targetLength = in_stack_ffffffffffffff94;
  cParams.windowLog = auVar1._0_4_;
  cParams.chainLog = auVar1._4_4_;
  cParams.hashLog = auVar1._8_4_;
  cParams.searchLog = auVar1._12_4_;
  cParams.minMatch = auVar1._16_4_;
  cParams.strategy = in_stack_ffffffffffffff98;
  cctx_local = (ZSTD_CCtx *)ZSTD_checkCParams(cParams);
  uVar2 = ERR_isError((size_t)cctx_local);
  if (uVar2 == 0) {
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_compress_internal(cctx,dst,dstCapacity,src,srcSize,dict,dictSize,params);
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_compress_advanced (ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict,size_t dictSize,
                               ZSTD_parameters params)
{
    DEBUGLOG(4, "ZSTD_compress_advanced");
    CHECK_F(ZSTD_checkCParams(params.cParams));
    return ZSTD_compress_internal(cctx,
                                  dst, dstCapacity,
                                  src, srcSize,
                                  dict, dictSize,
                                  params);
}